

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O2

t_int * scalarover_perf8(t_int *w)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  t_int tVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long lVar14;
  
  lVar4 = w[1];
  fVar3 = *(float *)w[2];
  lVar5 = w[3];
  tVar6 = w[4];
  fVar3 = (float)(~-(uint)(fVar3 != 0.0) & (uint)fVar3 | (uint)(1.0 / fVar3) & -(uint)(fVar3 != 0.0)
                 );
  for (lVar14 = 0; (int)tVar6 != (int)lVar14; lVar14 = lVar14 + 8) {
    pfVar1 = (float *)(lVar4 + lVar14 * 4);
    fVar7 = pfVar1[1];
    fVar8 = pfVar1[2];
    fVar9 = pfVar1[3];
    pfVar2 = (float *)(lVar4 + 0x10 + lVar14 * 4);
    fVar10 = *pfVar2;
    fVar11 = pfVar2[1];
    fVar12 = pfVar2[2];
    fVar13 = pfVar2[3];
    pfVar2 = (float *)(lVar5 + lVar14 * 4);
    *pfVar2 = *pfVar1 * fVar3;
    pfVar2[1] = fVar7 * fVar3;
    pfVar2[2] = fVar8 * fVar3;
    pfVar2[3] = fVar9 * fVar3;
    pfVar1 = (float *)(lVar5 + 0x10 + lVar14 * 4);
    *pfVar1 = fVar10 * fVar3;
    pfVar1[1] = fVar11 * fVar3;
    pfVar1[2] = fVar12 * fVar3;
    pfVar1[3] = fVar13 * fVar3;
  }
  return w + 5;
}

Assistant:

t_int *scalarover_perf8(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_float g = *(t_float *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    if (g) g = 1.f / g;
    for (; n; n -= 8, in += 8, out += 8)
    {
        t_sample f0 = in[0], f1 = in[1], f2 = in[2], f3 = in[3];
        t_sample f4 = in[4], f5 = in[5], f6 = in[6], f7 = in[7];

        out[0] = f0 * g; out[1] = f1 * g; out[2] = f2 * g; out[3] = f3 * g;
        out[4] = f4 * g; out[5] = f5 * g; out[6] = f6 * g; out[7] = f7 * g;
    }
    return (w+5);
}